

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O0

void __thiscall unit_test::main(unit_test *this,string *path)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  void *pvVar5;
  pointer ppVar6;
  string *in_RSI;
  const_iterator e;
  const_iterator p;
  bool flush;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  _Self local_58;
  _Self local_50 [3];
  request local_38 [39];
  byte local_11;
  
  local_11 = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  if (bVar1) {
    iVar2 = cppcms::application::response();
    cppcms::http::response::status(iVar2);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  if (bVar1) {
    local_11 = 1;
  }
  if ((local_11 & 1) != 0) {
    uVar3 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar3,0);
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  poVar4 = std::operator<<(poVar4,"path=");
  poVar4 = std::operator<<(poVar4,in_RSI);
  std::operator<<(poVar4,'\n');
  if ((local_11 & 1) != 0) {
    cppcms::application::response();
    pvVar5 = (void *)cppcms::http::response::out();
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  poVar4 = std::operator<<(poVar4,"method=");
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_(local_38);
  poVar4 = std::operator<<(poVar4,(string *)local_38);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)local_38);
  if ((local_11 & 1) != 0) {
    cppcms::application::response();
    pvVar5 = (void *)cppcms::http::response::out();
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  }
  cppcms::application::request();
  cppcms::http::request::post_abi_cxx11_();
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  cppcms::application::request();
  cppcms::http::request::post_abi_cxx11_();
  local_58._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while (bVar1 = std::operator!=(local_50,&local_58), bVar1) {
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff70);
    poVar4 = std::operator<<(poVar4,(string *)ppVar6);
    in_stack_ffffffffffffff70 = std::operator<<(poVar4,"=");
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff70);
    poVar4 = std::operator<<(in_stack_ffffffffffffff70,(string *)&ppVar6->second);
    std::operator<<(poVar4,'\n');
    if ((local_11 & 1) != 0) {
      cppcms::application::response();
      pvVar5 = (void *)cppcms::http::response::out();
      std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

virtual void main(std::string path)
	{
		bool flush=false;

		if(path=="/status")
			response().status(201);
		if(path=="/chunks")
			flush=true;

		if(flush)
			response().io_mode(cppcms::http::response::normal);
		response().out()<< "path=" << path << '\n' ;
		if(flush)
			response().out() << std::flush;

		response().out()<< "method=" << request().request_method() << '\n';
		if(flush)
			response().out() << std::flush;
		for(cppcms::http::request::form_type::const_iterator p=request().post().begin(),e=request().post().end();p!=e;++p){
			response().out() << p->first <<"=" << p->second << '\n';
			if(flush)
				response().out() << std::flush;
		}
	}